

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcePosition.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_sourcePosition_primitive_endColumn
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint in_EAX;
  uint uStack_18;
  uint32_t endColumn;
  
  uStack_18 = in_EAX;
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  _uStack_18 = (ulong)uStack_18;
  sysbvm_sourceCode_computeLineAndColumnForIndex
            (context,*(sysbvm_tuple_t *)(*arguments + 0x10),*(sysbvm_tuple_t *)(*arguments + 0x20),
             (uint32_t *)0x0,&endColumn);
  return (_uStack_18 >> 0x20) << 4 | 9;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_sourcePosition_primitive_endColumn(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)argumentCount;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_sourcePosition_t *sourcePosition = (sysbvm_sourcePosition_t*)arguments[0];
    uint32_t endColumn = 0;
    sysbvm_sourceCode_computeLineAndColumnForIndex(context, sourcePosition->sourceCode, sourcePosition->endIndex, NULL, &endColumn);
    return sysbvm_tuple_uint32_encode(context, endColumn);
}